

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET mpp_enc_proc_two_pass(Mpp *mpp,EncAsyncTaskInfo *task)

{
  RK_U32 RVar1;
  MppEnc pvVar2;
  EncImpl impl_00;
  void *hal_00;
  MppPacket s;
  RK_S32 RVar3;
  RK_U32 RVar4;
  EncFrmStatus *pEVar5;
  HalEncTask *task_00;
  size_t sVar6;
  RK_S32 pkt_len;
  RK_S32 hw_len;
  RK_S32 task_len;
  MppPacket packet;
  MppEncHal hal;
  EncImpl impl;
  HalEncTask *hal_task;
  EncFrmStatus *frm;
  EncCpbStatus *cpb;
  EncRcTaskInfo rc_info;
  EncFrmStatus frm_bak;
  EncRcTask *rc_task;
  MPP_RET ret;
  MppEncImpl *enc;
  EncAsyncTaskInfo *task_local;
  Mpp *mpp_local;
  
  pvVar2 = mpp->mEnc;
  rc_task._4_4_ = MPP_OK;
  RVar3 = mpp_enc_refs_next_frm_is_intra(*(MppEncRefs *)((long)pvVar2 + 0x210));
  if (RVar3 != 0) {
    rc_info.reserve._8_8_ = (task->rc).frm;
    memcpy(&cpb,&(task->rc).info,0x88);
    pEVar5 = &(task->rc).frm;
    task_00 = &task->task;
    impl_00 = *(EncImpl *)((long)pvVar2 + 8);
    hal_00 = *(void **)((long)pvVar2 + 0x10);
    s = (task->task).packet;
    RVar1 = (task->task).length;
    RVar3 = (task->task).hw_length;
    sVar6 = mpp_packet_get_length(s);
    if ((mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","task %d two pass mode enter\n","mpp_enc_proc_two_pass",
                 pEVar5->val >> 0x30);
    }
    memcpy(&(task->rc).info,(void *)((long)pvVar2 + 0x240),0x88);
    RVar4 = mpp_packet_get_segment_nb((task->task).packet);
    (task->task).segment_nb = RVar4;
    if ((mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_proc_two_pass",pEVar5->val >> 0x30);
    }
    mpp_enc_refs_get_cpb_pass1(*(MppEncRefs *)((long)pvVar2 + 0x210),&(task->rc).cpb);
    if ((mpp_enc_debug & 0x10000) != 0) {
      _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                 "mpp_enc_proc_two_pass",(task->rc).cpb.curr.val >> 0x30);
    }
    rc_task._4_4_ = enc_impl_proc_dpb(impl_00,task_00);
    if (rc_task._4_4_ == MPP_OK) {
      if ((mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_proc_two_pass",pEVar5->val >> 0x30)
        ;
      }
      rc_task._4_4_ = enc_impl_proc_hal(impl_00,task_00);
      if (rc_task._4_4_ == MPP_OK) {
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_proc_two_pass",
                     pEVar5->val >> 0x30);
        }
        rc_task._4_4_ = mpp_enc_hal_get_task(hal_00,task_00);
        if (rc_task._4_4_ == MPP_OK) {
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_proc_two_pass",
                       pEVar5->val >> 0x30);
          }
          rc_task._4_4_ = mpp_enc_hal_gen_regs(hal_00,task_00);
          if (rc_task._4_4_ == MPP_OK) {
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_proc_two_pass",
                         pEVar5->val >> 0x30);
            }
            rc_task._4_4_ = mpp_enc_hal_start(hal_00,task_00);
            if (rc_task._4_4_ == MPP_OK) {
              if ((mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_proc_two_pass",
                           pEVar5->val >> 0x30);
              }
              rc_task._4_4_ = mpp_enc_hal_wait(hal_00,task_00);
              if (rc_task._4_4_ == MPP_OK) {
                if ((mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_proc_two_pass",
                             pEVar5->val >> 0x30);
                }
                rc_task._4_4_ = mpp_enc_hal_ret_task(hal_00,task_00);
                if (rc_task._4_4_ == MPP_OK) {
                  mpp_packet_set_length(s,(long)(int)sVar6);
                  mpp_packet_set_segment_nb(s,(task->task).segment_nb);
                  (task->task).hw_length = RVar3;
                  (task->task).length = RVar1;
                  *pEVar5 = (EncFrmStatus)rc_info.reserve._8_8_;
                  memcpy(&(task->rc).info,&cpb,0x88);
                  if ((mpp_enc_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_enc","task %d two pass mode leave\n","mpp_enc_proc_two_pass",
                               pEVar5->val >> 0x30);
                  }
                }
                else {
                  _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_hal_ret_task:%-4d failed return %d",
                             (char *)0x0,mpp,0x654,rc_task._4_4_);
                }
              }
              else {
                _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_hal_wait:%-4d failed return %d",(char *)0x0,
                           mpp,0x651,rc_task._4_4_);
              }
            }
            else {
              _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_hal_start:%-4d failed return %d",(char *)0x0,
                         mpp,0x64e,rc_task._4_4_);
            }
          }
          else {
            _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d",(char *)0x0,
                       mpp,0x64b,rc_task._4_4_);
          }
        }
        else {
          _mpp_log_l(2,"mpp_enc","mpp %p mpp_enc_hal_get_task:%-4d failed return %d",(char *)0x0,mpp
                     ,0x648,rc_task._4_4_);
        }
      }
      else {
        _mpp_log_l(2,"mpp_enc","mpp %p enc_impl_proc_hal:%-4d failed return %d",(char *)0x0,mpp,
                   0x645,rc_task._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"mpp_enc","mpp %p enc_impl_proc_dpb:%-4d failed return %d",(char *)0x0,mpp,0x642,
                 rc_task._4_4_);
    }
  }
  return rc_task._4_4_;
}

Assistant:

static MPP_RET mpp_enc_proc_two_pass(Mpp *mpp, EncAsyncTaskInfo *task)
{
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MPP_RET ret = MPP_OK;

    if (mpp_enc_refs_next_frm_is_intra(enc->refs)) {
        EncRcTask *rc_task = &task->rc;
        EncFrmStatus frm_bak = rc_task->frm;
        EncRcTaskInfo rc_info = rc_task->info;
        EncCpbStatus *cpb = &rc_task->cpb;
        EncFrmStatus *frm = &rc_task->frm;
        HalEncTask *hal_task = &task->task;
        EncImpl impl = enc->impl;
        MppEncHal hal = enc->enc_hal;
        MppPacket packet = hal_task->packet;
        RK_S32 task_len = hal_task->length;
        RK_S32 hw_len = hal_task->hw_length;
        RK_S32 pkt_len = mpp_packet_get_length(packet);

        enc_dbg_detail("task %d two pass mode enter\n", frm->seq_idx);
        rc_task->info = enc->rc_info_prev;
        hal_task->segment_nb = mpp_packet_get_segment_nb(hal_task->packet);

        enc_dbg_detail("task %d enc proc dpb\n", frm->seq_idx);
        mpp_enc_refs_get_cpb_pass1(enc->refs, cpb);

        enc_dbg_frm_status("frm %d start ***********************************\n", cpb->curr.seq_idx);
        ENC_RUN_FUNC2(enc_impl_proc_dpb, impl, hal_task, mpp, ret);

        enc_dbg_detail("task %d enc proc hal\n", frm->seq_idx);
        ENC_RUN_FUNC2(enc_impl_proc_hal, impl, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal get task\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_get_task, hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal generate reg\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_gen_regs, hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal start\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_start, hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal wait\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_wait,  hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal ret task\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_ret_task, hal, hal_task, mpp, ret);

        //recover status & packet
        mpp_packet_set_length(packet, pkt_len);
        mpp_packet_set_segment_nb(packet, hal_task->segment_nb);
        hal_task->hw_length = hw_len;
        hal_task->length = task_len;

        *frm = frm_bak;
        rc_task->info = rc_info;

        enc_dbg_detail("task %d two pass mode leave\n", frm->seq_idx);
    }
TASK_DONE:
    return ret;
}